

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O0

void __thiscall
ON_Brep::Internal_AttachV5RegionTopologyAsUserData(ON_Brep *this,ON_BinaryArchive *archive)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ON_V5_BrepRegionTopologyUserData *this_00;
  bool bVar4;
  ON_V5_BrepRegionTopologyUserData *ud;
  bool bWriteRegionTopology;
  ON_BinaryArchive *archive_local;
  ON_Brep *this_local;
  
  iVar1 = ON_BinaryArchive::Archive3dmVersion(archive);
  if (iVar1 == 0x32) {
    bVar4 = false;
    if (this->m_region_topology != (ON_BrepRegionTopology *)0x0) {
      uVar2 = ON_ClassArray<ON_BrepFace>::UnsignedCount((ON_ClassArray<ON_BrepFace> *)&this->m_F);
      bVar4 = false;
      if (uVar2 != 0) {
        uVar2 = ON_ClassArray<ON_BrepFaceSide>::UnsignedCount
                          ((ON_ClassArray<ON_BrepFaceSide> *)this->m_region_topology);
        uVar3 = ON_ClassArray<ON_BrepFace>::UnsignedCount((ON_ClassArray<ON_BrepFace> *)&this->m_F);
        bVar4 = uVar2 == uVar3 * 2;
      }
    }
    if (bVar4) {
      this_00 = (ON_V5_BrepRegionTopologyUserData *)operator_new(0xd8);
      ON_V5_BrepRegionTopologyUserData::ON_V5_BrepRegionTopologyUserData(this_00);
      this_00->m_write_region_topology_ptr = this->m_region_topology;
      ON_Object::AttachUserData((ON_Object *)this,(ON_UserData *)this_00);
    }
  }
  return;
}

Assistant:

void ON_Brep::Internal_AttachV5RegionTopologyAsUserData(
  ON_BinaryArchive& archive
) const
{
  if ( archive.Archive3dmVersion() != 50 )
    return;

  const bool bWriteRegionTopology
    = (nullptr != m_region_topology)
    && (m_F.UnsignedCount() > 0)
    && (m_region_topology->m_FS.UnsignedCount() == 2 * m_F.UnsignedCount());

  if ( false == bWriteRegionTopology )
    return;

  ON_V5_BrepRegionTopologyUserData* ud = new ON_V5_BrepRegionTopologyUserData();
  ud->m_write_region_topology_ptr = m_region_topology;
  const_cast<ON_Brep*>(this)->AttachUserData(ud);
}